

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::getPartStates(Synth *this,bool *partStates)

{
  uint uVar1;
  int partNumber;
  long lVar2;
  
  if (this->opened == true) {
    lVar2 = 0;
    do {
      uVar1 = Part::getActiveNonReleasingPartialCount(this->parts[lVar2]);
      partStates[lVar2] = uVar1 != 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 9);
  }
  else {
    partStates[8] = false;
    partStates[0] = false;
    partStates[1] = false;
    partStates[2] = false;
    partStates[3] = false;
    partStates[4] = false;
    partStates[5] = false;
    partStates[6] = false;
    partStates[7] = false;
  }
  return;
}

Assistant:

void Synth::getPartStates(bool *partStates) const {
	if (!opened) {
		memset(partStates, 0, 9 * sizeof(bool));
		return;
	}
	for (int partNumber = 0; partNumber < 9; partNumber++) {
		const Part *part = parts[partNumber];
		partStates[partNumber] = part->getActiveNonReleasingPartialCount() > 0;
	}
}